

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

void cf_hc_baller_init(cf_hc_baller *b,Curl_cfilter *cf,Curl_easy *data,char *name,int transport)

{
  Curl_cfilter *pCVar1;
  void *pvVar2;
  CURLcode CVar3;
  curltime cVar4;
  
  pCVar1 = cf->next;
  pvVar2 = cf->ctx;
  b->name = name;
  cf->next = (Curl_cfilter *)0x0;
  cVar4 = Curl_now();
  (b->started).tv_sec = cVar4.tv_sec;
  (b->started).tv_usec = cVar4.tv_usec;
  CVar3 = Curl_cf_setup_insert_after(cf,data,*(Curl_dns_entry **)((long)pvVar2 + 8),transport,1);
  b->result = CVar3;
  b->cf = cf->next;
  cf->next = pCVar1;
  return;
}

Assistant:

static void cf_hc_baller_init(struct cf_hc_baller *b,
                              struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              const char *name,
                              int transport)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct Curl_cfilter *save = cf->next;

  b->name = name;
  cf->next = NULL;
  b->started = Curl_now();
  b->result = Curl_cf_setup_insert_after(cf, data, ctx->remotehost,
                                         transport, CURL_CF_SSL_ENABLE);
  b->cf = cf->next;
  cf->next = save;
}